

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

string * __thiscall
slang::SVInt::toString_abi_cxx11_(SVInt *this,LiteralBase base,bitwidth_t abbreviateThresholdBits)

{
  allocator<char> *__a;
  iterator __end;
  char in_DL;
  long in_RSI;
  string *in_RDI;
  SmallVector<char,_40UL> buffer;
  bool includeBase;
  bitwidth_t in_stack_000001d0;
  bool in_stack_000001d6;
  LiteralBase in_stack_000001d7;
  SmallVectorBase<char> *in_stack_000001d8;
  SVInt *in_stack_000001e0;
  allocator<char> *__beg;
  SmallVectorBase<char> *this_00;
  byte local_6e;
  allocator<char> local_6d [13];
  SmallVectorBase<char> local_60 [2];
  byte local_19;
  
  local_6e = 1;
  if (((in_DL == '\x02') && (local_6e = 1, *(int *)(in_RSI + 8) == 0x20)) &&
     (local_6e = 1, (*(byte *)(in_RSI + 0xc) & 1) != 0)) {
    local_6e = *(byte *)(in_RSI + 0xd);
  }
  local_19 = local_6e & 1;
  this_00 = local_60;
  SmallVector<char,_40UL>::SmallVector((SmallVector<char,_40UL> *)0xbb17cb);
  writeTo(in_stack_000001e0,in_stack_000001d8,in_stack_000001d7,in_stack_000001d6,in_stack_000001d0)
  ;
  __a = (allocator<char> *)SmallVectorBase<char>::begin(local_60);
  __end = SmallVectorBase<char>::end(local_60);
  __beg = local_6d;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char*,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (char *)__beg,__end,__a);
  std::allocator<char>::~allocator(local_6d);
  SmallVector<char,_40UL>::~SmallVector((SmallVector<char,_40UL> *)0xbb1858);
  return in_RDI;
}

Assistant:

std::string SVInt::toString(LiteralBase base, bitwidth_t abbreviateThresholdBits) const {
    // Append the base unless we're a signed 32-bit base 10 integer.
    bool includeBase = base != LiteralBase::Decimal || bitWidth != 32 || !signFlag || unknownFlag;

    SmallVector<char> buffer;
    writeTo(buffer, base, includeBase, abbreviateThresholdBits);
    return std::string(buffer.begin(), buffer.end());
}